

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O2

char * evutil_inet_ntop(int af,void *src,char *dst,size_t len)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  char *pcVar13;
  uint16_t words [8];
  char buf [64];
  undefined1 local_38 [8];
  
  if (af != 10) {
    if (af != 2) {
      return (char *)0x0;
    }
    uVar3 = *src;
    uVar3 = evutil_snprintf(dst,len,"%d.%d.%d.%d",(ulong)(uVar3 & 0xff),
                            (ulong)(((uVar3 & 0xff00) << 8) >> 0x10),
                            (ulong)((uVar3 & 0xff0000) >> 0x10),uVar3 >> 0x18);
    if (len <= uVar3) {
      dst = (char *)0x0;
    }
    if ((int)uVar3 < 0) {
      return (char *)0x0;
    }
    return dst;
  }
  for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
    uVar2 = *(ushort *)((long)src + lVar5 * 2);
    words[lVar5] = uVar2 << 8 | uVar2 >> 8;
  }
  if ((words._0_8_ == 0) && (words[4] == 0)) {
    if ((words[5] == 0xffff) || ((words[6] != 0 && words[7] != 0) && words[5] == 0)) {
      uVar7 = (ulong)*(byte *)((long)src + 0xe);
      bVar1 = *(byte *)((long)src + 0xf);
      if (words[5] == 0) {
        pcVar13 = "::%d.%d.%d.%d";
        uVar10 = (ulong)*(byte *)((long)src + 0xc);
        uVar8 = (ulong)*(byte *)((long)src + 0xd);
      }
      else {
        pcVar13 = "::%x:%d.%d.%d.%d";
        uVar10 = (ulong)words[5];
        uVar8 = (ulong)*(byte *)((long)src + 0xc);
        uVar7 = (ulong)*(byte *)((long)src + 0xd);
        bVar1 = *(byte *)((long)src + 0xe);
      }
      evutil_snprintf(buf,0x40,pcVar13,uVar10,uVar8,uVar7,(uint)bVar1);
      uVar7 = strlen(buf);
      goto LAB_001fc9c4;
    }
  }
  uVar7 = 0xffffffffffffffff;
  iVar4 = 0;
  iVar9 = 0;
  do {
    uVar8 = (ulong)iVar9;
    uVar10 = uVar8;
    while( true ) {
      uVar10 = uVar10 + 1;
      iVar9 = (int)uVar8;
      if (7 < iVar9) {
        iVar9 = (int)uVar7;
        if (iVar4 < 2) {
          iVar9 = -1;
        }
        pcVar13 = buf;
        uVar7 = 0;
        goto LAB_001fc8da;
      }
      if (words[uVar8] == 0) break;
      uVar8 = uVar8 + 1;
    }
    iVar11 = 8 - iVar9;
    iVar12 = -1;
    for (; uVar10 != 8; uVar10 = uVar10 + 1) {
      if (words[uVar10] != 0) {
        iVar9 = iVar9 - iVar12;
        iVar11 = -iVar12;
        goto LAB_001fc8ac;
      }
      iVar12 = iVar12 + -1;
    }
    iVar9 = 8;
LAB_001fc8ac:
    if (iVar4 < iVar11) {
      uVar7 = uVar8;
      iVar4 = iVar11;
    }
    uVar7 = uVar7 & 0xffffffff;
  } while( true );
LAB_001fc8da:
  iVar4 = (int)uVar7;
  if (iVar4 < 8) {
    if ((words[iVar4] == 0) && (iVar9 == iVar4)) {
      if (iVar9 == 0) {
        *pcVar13 = ':';
        pcVar13 = pcVar13 + 1;
      }
      *pcVar13 = ':';
      pcVar13 = pcVar13 + 1;
      for (uVar7 = (long)iVar9; (long)uVar7 < 8; uVar7 = uVar7 + 1) {
        if (words[uVar7] != 0) goto LAB_001fc8da;
      }
      uVar7 = 8;
    }
    else {
      evutil_snprintf(pcVar13,(size_t)(local_38 + -(long)pcVar13),"%x");
      sVar6 = strlen(pcVar13);
      pcVar13 = pcVar13 + sVar6;
      uVar7 = 8;
      if (iVar4 != 7) {
        *pcVar13 = ':';
        pcVar13 = pcVar13 + 1;
        uVar7 = (ulong)(iVar4 + 1);
      }
    }
    goto LAB_001fc8da;
  }
  *pcVar13 = '\0';
  uVar7 = strlen(buf);
LAB_001fc9c4:
  if (len < uVar7) {
    return (char *)0x0;
  }
  event_strlcpy_(dst,buf,len);
  return dst;
}

Assistant:

const char *
evutil_inet_ntop(int af, const void *src, char *dst, size_t len)
{
#if defined(EVENT__HAVE_INET_NTOP) && !defined(USE_INTERNAL_NTOP)
	return inet_ntop(af, src, dst, len);
#else
	if (af == AF_INET) {
		const struct in_addr *in = src;
		const ev_uint32_t a = ntohl(in->s_addr);
		int r;
		r = evutil_snprintf(dst, len, "%d.%d.%d.%d",
		    (int)(ev_uint8_t)((a>>24)&0xff),
		    (int)(ev_uint8_t)((a>>16)&0xff),
		    (int)(ev_uint8_t)((a>>8 )&0xff),
		    (int)(ev_uint8_t)((a    )&0xff));
		if (r<0||(size_t)r>=len)
			return NULL;
		else
			return dst;
#ifdef AF_INET6
	} else if (af == AF_INET6) {
		const struct in6_addr *addr = src;
		char buf[64], *cp;
		int longestGapLen = 0, longestGapPos = -1, i,
			curGapPos = -1, curGapLen = 0;
		ev_uint16_t words[8];
		for (i = 0; i < 8; ++i) {
			words[i] =
			    (((ev_uint16_t)addr->s6_addr[2*i])<<8) + addr->s6_addr[2*i+1];
		}
		if (words[0] == 0 && words[1] == 0 && words[2] == 0 && words[3] == 0 &&
		    words[4] == 0 && ((words[5] == 0 && words[6] && words[7]) ||
			(words[5] == 0xffff))) {
			/* This is an IPv4 address. */
			if (words[5] == 0) {
				evutil_snprintf(buf, sizeof(buf), "::%d.%d.%d.%d",
				    addr->s6_addr[12], addr->s6_addr[13],
				    addr->s6_addr[14], addr->s6_addr[15]);
			} else {
				evutil_snprintf(buf, sizeof(buf), "::%x:%d.%d.%d.%d", words[5],
				    addr->s6_addr[12], addr->s6_addr[13],
				    addr->s6_addr[14], addr->s6_addr[15]);
			}
			if (strlen(buf) > len)
				return NULL;
			strlcpy(dst, buf, len);
			return dst;
		}
		i = 0;
		while (i < 8) {
			if (words[i] == 0) {
				curGapPos = i++;
				curGapLen = 1;
				while (i<8 && words[i] == 0) {
					++i; ++curGapLen;
				}
				if (curGapLen > longestGapLen) {
					longestGapPos = curGapPos;
					longestGapLen = curGapLen;
				}
			} else {
				++i;
			}
		}
		if (longestGapLen<=1)
			longestGapPos = -1;

		cp = buf;
		for (i = 0; i < 8; ++i) {
			if (words[i] == 0 && longestGapPos == i) {
				if (i == 0)
					*cp++ = ':';
				*cp++ = ':';
				while (i < 8 && words[i] == 0)
					++i;
				--i; /* to compensate for loop increment. */
			} else {
				evutil_snprintf(cp,
								sizeof(buf)-(cp-buf), "%x", (unsigned)words[i]);
				cp += strlen(cp);
				if (i != 7)
					*cp++ = ':';
			}
		}
		*cp = '\0';
		if (strlen(buf) > len)
			return NULL;
		strlcpy(dst, buf, len);
		return dst;
#endif
	} else {
		return NULL;
	}
#endif
}